

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::ValidationState_t::RegisterFunction
          (ValidationState_t *this,uint32_t id,uint32_t ret_type_id,
          FunctionControlMask function_control,uint32_t function_type_id)

{
  bool bVar1;
  Function *local_28;
  uint32_t local_20;
  FunctionControlMask local_1c;
  uint32_t function_type_id_local;
  FunctionControlMask function_control_local;
  uint32_t ret_type_id_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  local_20 = function_type_id;
  local_1c = function_control;
  function_type_id_local = ret_type_id;
  function_control_local = id;
  _ret_type_id_local = this;
  bVar1 = in_function_body(this);
  if (bVar1) {
    __assert_fail("in_function_body() == false && \"RegisterFunction can only be called when parsing the binary outside \" \"of another function\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x1f9,
                  "spv_result_t spvtools::val::ValidationState_t::RegisterFunction(uint32_t, uint32_t, spv::FunctionControlMask, uint32_t)"
                 );
  }
  this->in_function_ = true;
  std::vector<spvtools::val::Function,std::allocator<spvtools::val::Function>>::
  emplace_back<unsigned_int&,unsigned_int&,spv::FunctionControlMask&,unsigned_int&>
            ((vector<spvtools::val::Function,std::allocator<spvtools::val::Function>> *)
             &this->module_functions_,&function_control_local,&function_type_id_local,&local_1c,
             &local_20);
  local_28 = current_function(this);
  std::
  unordered_map<unsigned_int,spvtools::val::Function*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Function*>>>
  ::emplace<unsigned_int&,spvtools::val::Function*>
            ((unordered_map<unsigned_int,spvtools::val::Function*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Function*>>>
              *)&this->id_to_function_,&function_control_local,&local_28);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidationState_t::RegisterFunction(
    uint32_t id, uint32_t ret_type_id,
    spv::FunctionControlMask function_control, uint32_t function_type_id) {
  assert(in_function_body() == false &&
         "RegisterFunction can only be called when parsing the binary outside "
         "of another function");
  in_function_ = true;
  module_functions_.emplace_back(id, ret_type_id, function_control,
                                 function_type_id);
  id_to_function_.emplace(id, &current_function());

  // TODO(umar): validate function type and type_id

  return SPV_SUCCESS;
}